

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmHttpProcessRequest(jx9_vm *pVm,char *zRequest,int nByte)

{
  undefined8 uVar1;
  sxi32 sVar2;
  ushort **ppuVar3;
  jx9_value *pjVar4;
  char *pcVar5;
  bool bVar6;
  char *local_168;
  char *local_160;
  char *local_158;
  int local_140;
  sxi32 local_13c;
  sxi32 iLen;
  sxi32 rc;
  sxi32 iVer;
  sxi32 iMethod;
  SySet sHeader;
  SyBlob sWorker;
  SyhttpUri sUri;
  SyhttpHeader *pHeader;
  jx9_value *pHeaderArray;
  SyString sRequest;
  SyString *pValue;
  SyString *pName;
  int nByte_local;
  char *zRequest_local;
  jx9_vm *pVm_local;
  
  pHeaderArray = (jx9_value *)zRequest;
  sRequest.zString._0_4_ = nByte;
  SySetInit((SySet *)&iVer,&pVm->sAllocator,0x20);
  SyBlobInit((SyBlob *)&sHeader.pUserData,&pVm->sAllocator);
  while( true ) {
    bVar6 = false;
    if (((int)sRequest.zString != 0) && (bVar6 = false, *(byte *)&pHeaderArray->x < 0xc0)) {
      ppuVar3 = __ctype_b_loc();
      bVar6 = ((*ppuVar3)[(int)*(char *)&pHeaderArray->x] & 0x2000) != 0;
    }
    if (!bVar6) break;
    sRequest.zString._0_4_ = (int)sRequest.zString + -1;
    pHeaderArray = (jx9_value *)((long)&pHeaderArray->x + 1);
  }
  while( true ) {
    bVar6 = false;
    if (((int)sRequest.zString != 0) &&
       (bVar6 = false, *(byte *)((long)&pHeaderArray->x + (ulong)((int)sRequest.zString - 1)) < 0xc0
       )) {
      ppuVar3 = __ctype_b_loc();
      bVar6 = ((*ppuVar3)
               [(int)*(char *)((long)&pHeaderArray->x + (ulong)((int)sRequest.zString - 1))] &
              0x2000) != 0;
    }
    if (!bVar6) break;
    sRequest.zString._0_4_ = (int)sRequest.zString + -1;
  }
  local_13c = VmHttpProcessFirstLine
                        ((SyString *)&pHeaderArray,&rc,(SyhttpUri *)&sWorker.nFlags,&iLen);
  pVm_local._4_4_ = local_13c;
  if (local_13c == 0) {
    VmHttpExtractHeaders((SyString *)&pHeaderArray,(SySet *)&iVer);
    pcVar5 = "HTTP/1.1";
    if (iLen == 1) {
      pcVar5 = "HTTP/1.0";
    }
    jx9_vm_config(pVm,8,"SERVER_PROTOCOL",pcVar5,8);
    if (rc == 1) {
      local_158 = "GET";
    }
    else {
      if (rc == 3) {
        local_160 = "POST";
      }
      else {
        if (rc == 4) {
          local_168 = "PUT";
        }
        else {
          local_168 = "OTHER";
          if (rc == 2) {
            local_168 = "HEAD";
          }
        }
        local_160 = local_168;
      }
      local_158 = local_160;
    }
    jx9_vm_config(pVm,8,"REQUEST_METHOD",local_158,0xffffffff);
    if (((uint)sUri.sQuery.zString != 0) && (rc == 1)) {
      sRequest._8_8_ = &sUri.sPath.nByte;
      jx9_vm_config(pVm,8,"QUERY_STRING",sUri.sPath._8_8_,(ulong)(uint)sUri.sQuery.zString);
      VmHttpSplitEncodedQuery(pVm,(SyString *)sRequest._8_8_,(SyBlob *)&sHeader.pUserData,0);
    }
    sRequest._8_8_ = &sUri.sPass.nByte;
    jx9_vm_config(pVm,8,"REQUEST_URI",sUri.sPass._8_8_,(ulong)(uint)sUri.sRaw.zString);
    sRequest._8_8_ = &sUri.sPort.nByte;
    jx9_vm_config(pVm,8,"PATH_INFO",sUri.sPort._8_8_,(ulong)(uint)sUri.sPath.zString);
    jx9_vm_config(pVm,8,"ORIG_PATH_INFO",*(undefined8 *)sRequest._8_8_,
                  (ulong)*(uint *)(sRequest._8_8_ + 8));
    sRequest._8_8_ = VmHttpExtractHeaderValue((SySet *)&iVer,"Accept",6);
    if ((SyString *)sRequest._8_8_ != (SyString *)0x0) {
      jx9_vm_config(pVm,8,"HTTP_ACCEPT",((SyString *)sRequest._8_8_)->zString,
                    (ulong)((SyString *)sRequest._8_8_)->nByte);
    }
    sRequest._8_8_ = VmHttpExtractHeaderValue((SySet *)&iVer,"Accept-Charset",0xe);
    if ((SyString *)sRequest._8_8_ != (SyString *)0x0) {
      jx9_vm_config(pVm,8,"HTTP_ACCEPT_CHARSET",((SyString *)sRequest._8_8_)->zString,
                    (ulong)((SyString *)sRequest._8_8_)->nByte);
    }
    sRequest._8_8_ = VmHttpExtractHeaderValue((SySet *)&iVer,"Accept-Encoding",0xf);
    if ((SyString *)sRequest._8_8_ != (SyString *)0x0) {
      jx9_vm_config(pVm,8,"HTTP_ACCEPT_ENCODING",((SyString *)sRequest._8_8_)->zString,
                    (ulong)((SyString *)sRequest._8_8_)->nByte);
    }
    sRequest._8_8_ = VmHttpExtractHeaderValue((SySet *)&iVer,"Accept-Language",0xf);
    if ((SyString *)sRequest._8_8_ != (SyString *)0x0) {
      jx9_vm_config(pVm,8,"HTTP_ACCEPT_LANGUAGE",((SyString *)sRequest._8_8_)->zString,
                    (ulong)((SyString *)sRequest._8_8_)->nByte);
    }
    sRequest._8_8_ = VmHttpExtractHeaderValue((SySet *)&iVer,"Connection",10);
    if ((SyString *)sRequest._8_8_ != (SyString *)0x0) {
      jx9_vm_config(pVm,8,"HTTP_CONNECTION",((SyString *)sRequest._8_8_)->zString,
                    (ulong)((SyString *)sRequest._8_8_)->nByte);
    }
    sRequest._8_8_ = VmHttpExtractHeaderValue((SySet *)&iVer,"Host",4);
    if ((SyString *)sRequest._8_8_ != (SyString *)0x0) {
      jx9_vm_config(pVm,8,"HTTP_HOST",((SyString *)sRequest._8_8_)->zString,
                    (ulong)((SyString *)sRequest._8_8_)->nByte);
    }
    sRequest._8_8_ = VmHttpExtractHeaderValue((SySet *)&iVer,"Referer",7);
    if ((SyString *)sRequest._8_8_ != (SyString *)0x0) {
      jx9_vm_config(pVm,8,"HTTP_REFERER",((SyString *)sRequest._8_8_)->zString,
                    (ulong)((SyString *)sRequest._8_8_)->nByte);
    }
    sRequest._8_8_ = VmHttpExtractHeaderValue((SySet *)&iVer,"User-Agent",10);
    if ((SyString *)sRequest._8_8_ != (SyString *)0x0) {
      jx9_vm_config(pVm,8,"HTTP_USER_AGENT",((SyString *)sRequest._8_8_)->zString,
                    (ulong)((SyString *)sRequest._8_8_)->nByte);
    }
    sRequest._8_8_ = VmHttpExtractHeaderValue((SySet *)&iVer,"Authorization",0xd);
    if ((SyString *)sRequest._8_8_ != (SyString *)0x0) {
      jx9_vm_config(pVm,8,"JX9_AUTH_DIGEST",((SyString *)sRequest._8_8_)->zString,
                    (ulong)((SyString *)sRequest._8_8_)->nByte);
      jx9_vm_config(pVm,8,"JX9_AUTH",*(undefined8 *)sRequest._8_8_,
                    (ulong)*(uint *)(sRequest._8_8_ + 8));
    }
    pjVar4 = VmExtractSuper(pVm,"_HEADER",7);
    SySetResetCursor((SySet *)&iVer);
    sUri.sRaw.nByte = 0;
    sUri.sRaw._12_4_ = 0;
    while (sVar2 = SySetGetNextEntry((SySet *)&iVer,(void **)&sUri.sRaw.nByte),
          uVar1 = sUri.sRaw._8_8_, sVar2 == 0) {
      sRequest._8_8_ = sUri.sRaw._8_8_ + 0x10;
      if ((pjVar4 != (jx9_value *)0x0) && ((pjVar4->iFlags & 0x40U) != 0)) {
        VmHashmapInsert((jx9_hashmap *)(pjVar4->x).pOther,*(char **)sUri.sRaw._8_8_,
                        *(int *)(sUri.sRaw._8_8_ + 8),*(char **)sRequest._8_8_,
                        *(int *)(sUri.sRaw._8_8_ + 0x18));
      }
      if (((*(int *)(uVar1 + 8) == 6) &&
          (sVar2 = SyStrnicmp(*(char **)uVar1,"Cookie",6), sVar2 == 0)) &&
         (*(int *)(sRequest._8_8_ + 8) != 0)) {
        VmHttpPorcessCookie(pVm,(SyBlob *)&sHeader.pUserData,*(char **)sRequest._8_8_,
                            *(sxu32 *)(sRequest._8_8_ + 8));
      }
    }
    if ((((rc == 3) &&
         (sRequest._8_8_ = VmHttpExtractHeaderValue((SySet *)&iVer,"Content-Type",0xc),
         (SyString *)sRequest._8_8_ != (SyString *)0x0)) &&
        (0x20 < ((SyString *)sRequest._8_8_)->nByte)) &&
       ((sVar2 = SyMemcmp("application/x-www-form-urlencoded",((SyString *)sRequest._8_8_)->zString,
                          ((SyString *)sRequest._8_8_)->nByte), sVar2 == 0 &&
        (sRequest._8_8_ = VmHttpExtractHeaderValue((SySet *)&iVer,"Content-Length",0xe),
        (SyString *)sRequest._8_8_ != (SyString *)0x0)))) {
      local_140 = 0;
      SyStrToInt32(((SyString *)sRequest._8_8_)->zString,((SyString *)sRequest._8_8_)->nByte,
                   &local_140,(char **)0x0);
      if (0 < local_140) {
        while( true ) {
          bVar6 = false;
          if (((int)sRequest.zString != 0) && (bVar6 = false, *(byte *)&pHeaderArray->x < 0xc0)) {
            ppuVar3 = __ctype_b_loc();
            bVar6 = ((*ppuVar3)[(int)*(char *)&pHeaderArray->x] & 0x2000) != 0;
          }
          if (!bVar6) break;
          sRequest.zString._0_4_ = (int)sRequest.zString + -1;
          pHeaderArray = (jx9_value *)((long)&pHeaderArray->x + 1);
        }
        while( true ) {
          bVar6 = false;
          if (((int)sRequest.zString != 0) &&
             (bVar6 = false,
             *(byte *)((long)&pHeaderArray->x + (ulong)((int)sRequest.zString - 1)) < 0xc0)) {
            ppuVar3 = __ctype_b_loc();
            bVar6 = ((*ppuVar3)
                     [(int)*(char *)((long)&pHeaderArray->x + (ulong)((int)sRequest.zString - 1))] &
                    0x2000) != 0;
          }
          if (!bVar6) break;
          sRequest.zString._0_4_ = (int)sRequest.zString + -1;
        }
        if (local_140 < (int)sRequest.zString) {
          sRequest.zString._0_4_ = local_140;
        }
        VmHttpSplitEncodedQuery(pVm,(SyString *)&pHeaderArray,(SyBlob *)&sHeader.pUserData,1);
      }
    }
    SySetRelease((SySet *)&iVer);
    SyBlobRelease((SyBlob *)&sHeader.pUserData);
    pVm_local._4_4_ = 0;
  }
  return pVm_local._4_4_;
}

Assistant:

static sxi32 VmHttpProcessRequest(jx9_vm *pVm, const char *zRequest, int nByte)
 {
	 SyString *pName, *pValue, sRequest; /* Raw HTTP request */
	 jx9_value *pHeaderArray;          /* $_HEADER superglobal (Symisc eXtension to the JX9 specification)*/
	 SyhttpHeader *pHeader;            /* MIME header */
	 SyhttpUri sUri;     /* Parse of the raw URI*/
	 SyBlob sWorker;     /* General purpose working buffer */
	 SySet sHeader;      /* MIME headers set */
	 sxi32 iMethod;      /* HTTP method [i.e: GET, POST, HEAD...]*/
	 sxi32 iVer;         /* HTTP protocol version */
	 sxi32 rc;
	 SyStringInitFromBuf(&sRequest, zRequest, nByte);
	 SySetInit(&sHeader, &pVm->sAllocator, sizeof(SyhttpHeader));
	 SyBlobInit(&sWorker, &pVm->sAllocator);
	 /* Ignore leading and trailing white spaces*/
	 SyStringFullTrim(&sRequest);
	 /* Process the first line */
	 rc = VmHttpProcessFirstLine(&sRequest, &iMethod, &sUri, &iVer);
	 if( rc != SXRET_OK ){
		 return rc;
	 }
	 /* Process MIME headers */
	 VmHttpExtractHeaders(&sRequest, &sHeader);
	 /*
	  * Setup $_SERVER environments 
	  */
	 /* 'SERVER_PROTOCOL': Name and revision of the information protocol via which the page was requested */
	 jx9_vm_config(pVm, 
		 JX9_VM_CONFIG_SERVER_ATTR, 
		 "SERVER_PROTOCOL", 
		 iVer == HTTP_PROTO_10 ? "HTTP/1.0" : "HTTP/1.1", 
		 sizeof("HTTP/1.1")-1
		 );
	 /* 'REQUEST_METHOD':  Which request method was used to access the page */
	 jx9_vm_config(pVm, 
		 JX9_VM_CONFIG_SERVER_ATTR, 
		 "REQUEST_METHOD", 
		 iMethod == HTTP_METHOD_GET ?   "GET" : 
		 (iMethod == HTTP_METHOD_POST ? "POST":
		 (iMethod == HTTP_METHOD_PUT  ? "PUT" :
		 (iMethod == HTTP_METHOD_HEAD ?  "HEAD" : "OTHER"))), 
		 -1 /* Compute attribute length automatically */
		 );
	 if( SyStringLength(&sUri.sQuery) > 0 && iMethod == HTTP_METHOD_GET ){
		 pValue = &sUri.sQuery;
		 /* 'QUERY_STRING': The query string, if any, via which the page was accessed */
		 jx9_vm_config(pVm, 
			 JX9_VM_CONFIG_SERVER_ATTR, 
			 "QUERY_STRING", 
			 pValue->zString, 
			 pValue->nByte
			 );
		 /* Decoded the raw query */
		 VmHttpSplitEncodedQuery(&(*pVm), pValue, &sWorker, FALSE);
	 }
	 /* REQUEST_URI: The URI which was given in order to access this page; for instance, '/index.html' */
	 pValue = &sUri.sRaw;
	 jx9_vm_config(pVm, 
		 JX9_VM_CONFIG_SERVER_ATTR, 
		 "REQUEST_URI", 
		 pValue->zString, 
		 pValue->nByte
		 );
	 /*
	  * 'PATH_INFO'
	  * 'ORIG_PATH_INFO' 
      * Contains any client-provided pathname information trailing the actual script filename but preceding
	  * the query string, if available. For instance, if the current script was accessed via the URL
	  * http://www.example.com/jx9/path_info.jx9/some/stuff?foo=bar, then $_SERVER['PATH_INFO'] would contain
	  * /some/stuff. 
	  */
	 pValue = &sUri.sPath;
	 jx9_vm_config(pVm, 
		 JX9_VM_CONFIG_SERVER_ATTR, 
		 "PATH_INFO", 
		 pValue->zString, 
		 pValue->nByte
		 );
	 jx9_vm_config(pVm, 
		 JX9_VM_CONFIG_SERVER_ATTR, 
		 "ORIG_PATH_INFO", 
		 pValue->zString, 
		 pValue->nByte
		 );
	 /* 'HTTP_ACCEPT': Contents of the Accept: header from the current request, if there is one */
	 pValue = VmHttpExtractHeaderValue(&sHeader, "Accept", sizeof("Accept")-1);
	 if( pValue ){
		 jx9_vm_config(pVm, 
			 JX9_VM_CONFIG_SERVER_ATTR, 
			 "HTTP_ACCEPT", 
			 pValue->zString, 
			 pValue->nByte
		 );
	 }
	 /* 'HTTP_ACCEPT_CHARSET': Contents of the Accept-Charset: header from the current request, if there is one. */
	 pValue = VmHttpExtractHeaderValue(&sHeader, "Accept-Charset", sizeof("Accept-Charset")-1);
	 if( pValue ){
		 jx9_vm_config(pVm, 
			 JX9_VM_CONFIG_SERVER_ATTR, 
			 "HTTP_ACCEPT_CHARSET", 
			 pValue->zString, 
			 pValue->nByte
		 );
	 }
	 /* 'HTTP_ACCEPT_ENCODING': Contents of the Accept-Encoding: header from the current request, if there is one. */
	 pValue = VmHttpExtractHeaderValue(&sHeader, "Accept-Encoding", sizeof("Accept-Encoding")-1);
	 if( pValue ){
		 jx9_vm_config(pVm, 
			 JX9_VM_CONFIG_SERVER_ATTR, 
			 "HTTP_ACCEPT_ENCODING", 
			 pValue->zString, 
			 pValue->nByte
		 );
	 }
	  /* 'HTTP_ACCEPT_LANGUAGE': Contents of the Accept-Language: header from the current request, if there is one */
	 pValue = VmHttpExtractHeaderValue(&sHeader, "Accept-Language", sizeof("Accept-Language")-1);
	 if( pValue ){
		 jx9_vm_config(pVm, 
			 JX9_VM_CONFIG_SERVER_ATTR, 
			 "HTTP_ACCEPT_LANGUAGE", 
			 pValue->zString, 
			 pValue->nByte
		 );
	 }
	 /* 'HTTP_CONNECTION': Contents of the Connection: header from the current request, if there is one. */
	 pValue = VmHttpExtractHeaderValue(&sHeader, "Connection", sizeof("Connection")-1);
	 if( pValue ){
		 jx9_vm_config(pVm, 
			 JX9_VM_CONFIG_SERVER_ATTR, 
			 "HTTP_CONNECTION", 
			 pValue->zString, 
			 pValue->nByte
		 );
	 }
	 /* 'HTTP_HOST': Contents of the Host: header from the current request, if there is one. */
	 pValue = VmHttpExtractHeaderValue(&sHeader, "Host", sizeof("Host")-1);
	 if( pValue ){
		 jx9_vm_config(pVm, 
			 JX9_VM_CONFIG_SERVER_ATTR, 
			 "HTTP_HOST", 
			 pValue->zString, 
			 pValue->nByte
		 );
	 }
	 /* 'HTTP_REFERER': Contents of the Referer: header from the current request, if there is one. */
	 pValue = VmHttpExtractHeaderValue(&sHeader, "Referer", sizeof("Referer")-1);
	 if( pValue ){
		 jx9_vm_config(pVm, 
			 JX9_VM_CONFIG_SERVER_ATTR, 
			 "HTTP_REFERER", 
			 pValue->zString, 
			 pValue->nByte
		 );
	 }
	 /* 'HTTP_USER_AGENT': Contents of the Referer: header from the current request, if there is one. */
	 pValue = VmHttpExtractHeaderValue(&sHeader, "User-Agent", sizeof("User-Agent")-1);
	 if( pValue ){
		 jx9_vm_config(pVm, 
			 JX9_VM_CONFIG_SERVER_ATTR, 
			 "HTTP_USER_AGENT", 
			 pValue->zString, 
			 pValue->nByte
		 );
	 }
	  /* 'JX9_AUTH_DIGEST': When doing Digest HTTP authentication this variable is set to the 'Authorization'
	   * header sent by the client (which you should then use to make the appropriate validation).
	   */
	 pValue = VmHttpExtractHeaderValue(&sHeader, "Authorization", sizeof("Authorization")-1);
	 if( pValue ){
		 jx9_vm_config(pVm, 
			 JX9_VM_CONFIG_SERVER_ATTR, 
			 "JX9_AUTH_DIGEST", 
			 pValue->zString, 
			 pValue->nByte
		 );
		 jx9_vm_config(pVm, 
			 JX9_VM_CONFIG_SERVER_ATTR, 
			 "JX9_AUTH", 
			 pValue->zString, 
			 pValue->nByte
		 );
	 }
	 /* Install all clients HTTP headers in the $_HEADER superglobal */
	 pHeaderArray = VmExtractSuper(&(*pVm), "_HEADER", sizeof("_HEADER")-1);
	 /* Iterate throw the available MIME headers*/
	 SySetResetCursor(&sHeader);
	 pHeader = 0; /* stupid cc warning */
	 while( SXRET_OK == SySetGetNextEntry(&sHeader, (void **)&pHeader) ){
		 pName  = &pHeader->sName;
		 pValue = &pHeader->sValue;
		 if( pHeaderArray && (pHeaderArray->iFlags & MEMOBJ_HASHMAP)){
			 /* Insert the MIME header and it's associated value */
			 VmHashmapInsert((jx9_hashmap *)pHeaderArray->x.pOther, 
				 pName->zString, (int)pName->nByte, 
				 pValue->zString, (int)pValue->nByte
				 );
		 }
		 if( pName->nByte == sizeof("Cookie")-1 && SyStrnicmp(pName->zString, "Cookie", sizeof("Cookie")-1) == 0 
			 && pValue->nByte > 0){
				 /* Process the name=value pair and insert them in the $_COOKIE superglobal array */
				 VmHttpPorcessCookie(&(*pVm), &sWorker, pValue->zString, pValue->nByte);
		 }
	 }
	 if( iMethod == HTTP_METHOD_POST ){
		 /* Extract raw POST data */
		 pValue = VmHttpExtractHeaderValue(&sHeader, "Content-Type", sizeof("Content-Type") - 1);
		 if( pValue && pValue->nByte >= sizeof("application/x-www-form-urlencoded") - 1 &&
			 SyMemcmp("application/x-www-form-urlencoded", pValue->zString, pValue->nByte) == 0 ){
				 /* Extract POST data length */
				 pValue = VmHttpExtractHeaderValue(&sHeader, "Content-Length", sizeof("Content-Length") - 1);
				 if( pValue ){
					 sxi32 iLen = 0; /* POST data length */
					 SyStrToInt32(pValue->zString, pValue->nByte, (void *)&iLen, 0);
					 if( iLen > 0 ){
						 /* Remove leading and trailing white spaces */
						 SyStringFullTrim(&sRequest);
						 if( (int)sRequest.nByte > iLen ){
							 sRequest.nByte = (sxu32)iLen;
						 }
						 /* Decode POST data now */
						 VmHttpSplitEncodedQuery(&(*pVm), &sRequest, &sWorker, TRUE);
					 }
				 }
		 }
	 }
	 /* All done, clean-up the mess left behind */
	 SySetRelease(&sHeader);
	 SyBlobRelease(&sWorker);
	 return SXRET_OK;
 }